

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIToolchains.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_ade4c7::Toolchains::DumpToolchain
          (Value *__return_storage_ptr__,Toolchains *this,string *lang)

{
  initializer_list<(anonymous_namespace)::ToolchainVariable> __l;
  initializer_list<(anonymous_namespace)::ToolchainVariable> __l_00;
  int iVar1;
  cmake *this_00;
  cmGlobalGenerator *this_01;
  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  *this_02;
  Value *pVVar2;
  pointer pcVar3;
  ToolchainVariable *local_4d0;
  ToolchainVariable *local_418;
  Value local_358;
  Value local_330;
  Value local_308;
  undefined1 local_2d9;
  const_reference local_2d8;
  value_type *mf;
  allocator<char> local_2c8;
  allocator<char> local_2c7;
  allocator<(anonymous_namespace)::ToolchainVariable> local_2c6;
  undefined1 local_2c5;
  undefined1 local_2c4;
  allocator<char> local_2c3;
  allocator<char> local_2c2;
  undefined1 local_2c1;
  allocator<char> local_2c0;
  allocator<char> local_2bf;
  undefined1 local_2be;
  allocator<char> local_2bd;
  allocator<char> local_2bc;
  undefined1 local_2bb;
  allocator<char> local_2ba;
  allocator<char> local_2b9;
  ToolchainVariable *local_2b8;
  ToolchainVariable local_2b0;
  string local_268 [32];
  string asStack_248 [32];
  undefined1 local_228;
  string local_220 [32];
  string asStack_200 [32];
  undefined1 local_1e0;
  string local_1d8 [32];
  string asStack_1b8 [32];
  undefined1 local_198;
  iterator local_190;
  size_type local_188;
  allocator<(anonymous_namespace)::ToolchainVariable> local_179 [3];
  allocator<char> local_176;
  allocator<char> local_175 [2];
  allocator<char> local_173;
  allocator<char> local_172 [2];
  allocator<char> local_170;
  allocator<char> local_16f;
  undefined1 local_16e;
  allocator<char> local_16d [20];
  allocator<char> local_159 [9];
  ToolchainVariable local_150;
  string local_108 [32];
  string asStack_e8 [32];
  undefined1 local_c8;
  string local_c0 [32];
  string asStack_a0 [32];
  undefined1 local_80;
  string local_78 [32];
  string asStack_58 [32];
  undefined1 local_38;
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  string *lang_local;
  Toolchains *this_local;
  Value *toolchain;
  
  local_20 = (undefined1  [8])lang;
  lang_local = (string *)this;
  this_local = (Toolchains *)__return_storage_ptr__;
  if (((anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
       CompilerVariables == '\0') &&
     (iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::Toolchains::
                                   DumpToolchain(std::__cxx11::string_const&)::CompilerVariables),
     iVar1 != 0)) {
    local_179[1] = (allocator<(anonymous_namespace)::ToolchainVariable>)0x1;
    local_159._1_8_ = &local_150;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"path",local_159);
    local_16e = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150.VariableSuffix,"COMPILER",local_16d);
    local_150.IsList = false;
    local_16e = 0;
    local_159._1_8_ = local_108;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_108,"id",&local_16f);
    local_172[1] = (allocator<char>)0x1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_e8,"COMPILER_ID",&local_170);
    local_c8 = 0;
    local_172[1] = (allocator<char>)0x0;
    local_159._1_8_ = local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c0,"version",local_172);
    local_175[1] = (allocator<char>)0x1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_a0,"COMPILER_VERSION",&local_173);
    local_80 = 0;
    local_175[1] = (allocator<char>)0x0;
    local_159._1_8_ = local_78;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_78,"target",local_175);
    local_179[2] = (allocator<(anonymous_namespace)::ToolchainVariable>)0x1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_58,"COMPILER_TARGET",&local_176);
    local_38 = 0;
    local_179[2] = (allocator<(anonymous_namespace)::ToolchainVariable>)0x0;
    local_179[1] = (allocator<(anonymous_namespace)::ToolchainVariable>)0x0;
    local_30 = &local_150;
    local_28 = 4;
    std::allocator<(anonymous_namespace)::ToolchainVariable>::allocator(local_179);
    __l_00._M_len = local_28;
    __l_00._M_array = local_30;
    std::
    vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
    ::vector(&DumpToolchain::CompilerVariables,__l_00,local_179);
    std::allocator<(anonymous_namespace)::ToolchainVariable>::~allocator(local_179);
    local_418 = (ToolchainVariable *)&local_30;
    do {
      local_418 = local_418 + -1;
      ToolchainVariable::~ToolchainVariable(local_418);
    } while (local_418 != &local_150);
    std::allocator<char>::~allocator(&local_176);
    std::allocator<char>::~allocator(local_175);
    std::allocator<char>::~allocator(&local_173);
    std::allocator<char>::~allocator(local_172);
    std::allocator<char>::~allocator(&local_170);
    std::allocator<char>::~allocator(&local_16f);
    std::allocator<char>::~allocator(local_16d);
    std::allocator<char>::~allocator(local_159);
    __cxa_atexit(std::
                 vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                 ::~vector,&DumpToolchain::CompilerVariables,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::Toolchains::
                         DumpToolchain(std::__cxx11::string_const&)::CompilerVariables);
  }
  if (((anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
       CompilerImplicitVariables == '\0') &&
     (iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::Toolchains::
                                   DumpToolchain(std::__cxx11::string_const&)::
                                   CompilerImplicitVariables), iVar1 != 0)) {
    local_2c5 = 1;
    local_2b8 = &local_2b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"includeDirectories",&local_2b9);
    local_2bb = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0.VariableSuffix,"IMPLICIT_INCLUDE_DIRECTORIES",&local_2ba);
    local_2b0.IsList = true;
    local_2bb = 0;
    local_2b8 = (ToolchainVariable *)local_268;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_268,"linkDirectories",&local_2bc);
    local_2be = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (asStack_248,"IMPLICIT_LINK_DIRECTORIES",&local_2bd);
    local_228 = 1;
    local_2be = 0;
    local_2b8 = (ToolchainVariable *)local_220;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_220,"linkFrameworkDirectories",&local_2bf);
    local_2c1 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (asStack_200,"IMPLICIT_LINK_FRAMEWORK_DIRECTORIES",&local_2c0);
    local_1e0 = 1;
    local_2c1 = 0;
    local_2b8 = (ToolchainVariable *)local_1d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1d8,"linkLibraries",&local_2c2);
    local_2c4 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (asStack_1b8,"IMPLICIT_LINK_LIBRARIES",&local_2c3);
    local_198 = 1;
    local_2c4 = 0;
    local_2c5 = 0;
    local_190 = &local_2b0;
    local_188 = 4;
    std::allocator<(anonymous_namespace)::ToolchainVariable>::allocator(&local_2c6);
    __l._M_len = local_188;
    __l._M_array = local_190;
    std::
    vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
    ::vector(&DumpToolchain::CompilerImplicitVariables,__l,&local_2c6);
    std::allocator<(anonymous_namespace)::ToolchainVariable>::~allocator(&local_2c6);
    local_4d0 = (ToolchainVariable *)&local_190;
    do {
      local_4d0 = local_4d0 + -1;
      ToolchainVariable::~ToolchainVariable(local_4d0);
    } while (local_4d0 != &local_2b0);
    std::allocator<char>::~allocator(&local_2c3);
    std::allocator<char>::~allocator(&local_2c2);
    std::allocator<char>::~allocator(&local_2c0);
    std::allocator<char>::~allocator(&local_2bf);
    std::allocator<char>::~allocator(&local_2bd);
    std::allocator<char>::~allocator(&local_2bc);
    std::allocator<char>::~allocator(&local_2ba);
    std::allocator<char>::~allocator(&local_2b9);
    __cxa_atexit(std::
                 vector<(anonymous_namespace)::ToolchainVariable,_std::allocator<(anonymous_namespace)::ToolchainVariable>_>
                 ::~vector,&DumpToolchain::CompilerImplicitVariables,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::Toolchains::
                         DumpToolchain(std::__cxx11::string_const&)::CompilerImplicitVariables);
  }
  if (((anonymous_namespace)::Toolchains::DumpToolchain(std::__cxx11::string_const&)::
       SourceFileExtensionsVariable == '\0') &&
     (iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::Toolchains::
                                   DumpToolchain(std::__cxx11::string_const&)::
                                   SourceFileExtensionsVariable), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&DumpToolchain::SourceFileExtensionsVariable,"sourceFileExtensions",
               &local_2c7);
    mf._7_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&DumpToolchain::SourceFileExtensionsVariable.VariableSuffix,
               "SOURCE_FILE_EXTENSIONS",&local_2c8);
    DumpToolchain::SourceFileExtensionsVariable.IsList = true;
    mf._7_1_ = 0;
    std::allocator<char>::~allocator(&local_2c8);
    std::allocator<char>::~allocator(&local_2c7);
    __cxa_atexit(ToolchainVariable::~ToolchainVariable,&DumpToolchain::SourceFileExtensionsVariable,
                 &__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::Toolchains::
                         DumpToolchain(std::__cxx11::string_const&)::SourceFileExtensionsVariable);
  }
  this_00 = cmFileAPI::GetCMakeInstance(this->FileAPI);
  this_01 = cmake::GetGlobalGenerator(this_00);
  this_02 = cmGlobalGenerator::GetMakefiles(this_01);
  local_2d8 = std::
              vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
              ::operator[](this_02,0);
  local_2d9 = 0;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_308,(String *)local_20);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"language");
  Json::Value::operator=(pVVar2,&local_308);
  Json::Value::~Value(&local_308);
  pcVar3 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get(local_2d8);
  DumpToolchainVariables
            (&local_330,this,pcVar3,(string *)local_20,&DumpToolchain::CompilerVariables);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"compiler");
  Json::Value::operator=(pVVar2,&local_330);
  Json::Value::~Value(&local_330);
  pcVar3 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get(local_2d8);
  DumpToolchainVariables
            (&local_358,this,pcVar3,(string *)local_20,&DumpToolchain::CompilerImplicitVariables);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"compiler");
  pVVar2 = Json::Value::operator[](pVVar2,"implicit");
  Json::Value::operator=(pVVar2,&local_358);
  Json::Value::~Value(&local_358);
  pcVar3 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get(local_2d8);
  DumpToolchainVariable
            (this,pcVar3,__return_storage_ptr__,(string *)local_20,
             &DumpToolchain::SourceFileExtensionsVariable);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Toolchains::DumpToolchain(std::string const& lang)
{
  static const std::vector<ToolchainVariable> CompilerVariables{
    { "path", "COMPILER", false },
    { "id", "COMPILER_ID", false },
    { "version", "COMPILER_VERSION", false },
    { "target", "COMPILER_TARGET", false },
  };

  static const std::vector<ToolchainVariable> CompilerImplicitVariables{
    { "includeDirectories", "IMPLICIT_INCLUDE_DIRECTORIES", true },
    { "linkDirectories", "IMPLICIT_LINK_DIRECTORIES", true },
    { "linkFrameworkDirectories", "IMPLICIT_LINK_FRAMEWORK_DIRECTORIES",
      true },
    { "linkLibraries", "IMPLICIT_LINK_LIBRARIES", true },
  };

  static const ToolchainVariable SourceFileExtensionsVariable{
    "sourceFileExtensions", "SOURCE_FILE_EXTENSIONS", true
  };

  const auto& mf =
    this->FileAPI.GetCMakeInstance()->GetGlobalGenerator()->GetMakefiles()[0];
  Json::Value toolchain = Json::objectValue;
  toolchain["language"] = lang;
  toolchain["compiler"] =
    this->DumpToolchainVariables(mf.get(), lang, CompilerVariables);
  toolchain["compiler"]["implicit"] =
    this->DumpToolchainVariables(mf.get(), lang, CompilerImplicitVariables);
  this->DumpToolchainVariable(mf.get(), toolchain, lang,
                              SourceFileExtensionsVariable);
  return toolchain;
}